

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O0

void spread_monsters(chunk *c,char *type,wchar_t depth,wchar_t num,wchar_t y0,wchar_t x0,wchar_t dy,
                    wchar_t dx,uint8_t origin)

{
  ushort uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  monster_race *pmVar5;
  loc_conflict lVar6;
  wchar_t local_3c;
  wchar_t start_mon_num;
  wchar_t x;
  wchar_t y;
  wchar_t count;
  wchar_t j;
  wchar_t i;
  wchar_t x0_local;
  wchar_t y0_local;
  wchar_t num_local;
  wchar_t depth_local;
  char *type_local;
  chunk *c_local;
  
  uVar1 = c->mon_max;
  _Var2 = mon_restrict(type,depth,c->depth,true);
  if ((_Var2) && (pmVar5 = get_mon_num(depth,c->depth), pmVar5 != (monster_race *)0x0)) {
    x = L'\0';
    local_3c = x0;
    start_mon_num = y0;
    for (count = L'\0'; x < num && count < L'2'; count = count + L'\x01') {
      if ((dy == L'\0') && (dx == L'\0')) {
        lVar6 = (loc_conflict)loc(x0,y0);
        _Var2 = square_in_bounds(c,lVar6);
        local_3c = x0;
        start_mon_num = y0;
        if (!_Var2) {
          mon_restrict((char *)0x0,depth,c->depth,true);
          return;
        }
      }
      else {
        for (y = L'\0'; y < L'\n'; y = y + L'\x01') {
          uVar3 = Rand_div(dy * 2 + 1);
          start_mon_num = (y0 + uVar3) - dy;
          uVar3 = Rand_div(dx * 2 + 1);
          local_3c = (x0 + uVar3) - dx;
          lVar6 = (loc_conflict)loc(local_3c,start_mon_num);
          _Var2 = square_in_bounds(c,lVar6);
          if (_Var2) break;
          if (L'\b' < y) {
            mon_restrict((char *)0x0,depth,c->depth,true);
            return;
          }
        }
      }
      lVar6 = (loc_conflict)loc(local_3c,start_mon_num);
      _Var2 = square_isempty(c,lVar6);
      if (_Var2) {
        lVar6 = (loc_conflict)loc(local_3c,start_mon_num);
        pick_and_place_monster(c,lVar6,depth,true,true,origin);
        iVar4 = (uint)c->mon_max - (uint)uVar1;
        if (iVar4 != num * 2 && SBORROW4(iVar4,num * 2) == iVar4 + num * -2 < 0) break;
        x = x + L'\x01';
        count = L'\0';
      }
    }
    mon_restrict((char *)0x0,depth,c->depth,true);
  }
  return;
}

Assistant:

void spread_monsters(struct chunk *c, const char *type, int depth, int num, 
		int y0, int x0, int dy, int dx, uint8_t origin)
{
	int i, j;
	int count;
	int y = y0, x = x0;
	int start_mon_num = c->mon_max;

	/* Restrict monsters.  Allow uniques. Leave area empty if none found. */
	if (!mon_restrict(type, depth, c->depth, true))
		return;

	/* Build the monster probability table. */
	if (!get_mon_num(depth, c->depth))
		return;


	/* Try to summon monsters within our rectangle of effect. */
	for (count = 0, i = 0; ((count < num) && (i < 50)); i++) {
		/* Get a location */
		if ((dy == 0) && (dx == 0)) {
			y = y0;
			x = x0;
			if (!square_in_bounds(c, loc(x, y))) {
				(void) mon_restrict(NULL, depth,
					c->depth, true);
				return;
			}
		} else {
			for (j = 0; j < 10; j++) {
				y = rand_spread(y0, dy);
				x = rand_spread(x0, dx);
				if (!square_in_bounds(c, loc(x, y))) {
					if (j < 9) {
						continue;
					} else {
						(void) mon_restrict(NULL, depth,
							c->depth, true);
						return;
					}
				}
				break;
			}
		}

		/* Require "empty" floor grids */
		if (!square_isempty(c, loc(x, y))) continue;

		/* Place the monster (sleeping, allow groups) */
		pick_and_place_monster(c, loc(x, y), depth, true, true, origin);

		/* Rein in monster groups and escorts a little. */
		if (c->mon_max - start_mon_num > num * 2)
			break;

		/* Count the monster(s), reset the loop count */
		count++;
		i = 0;
	}

	/* Remove monster restrictions. */
	(void) mon_restrict(NULL, depth, c->depth, true);
}